

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ParseUri(char *zDefaultVfs,char *zUri,uint *pFlags,sqlite3_vfs **ppVfs,char **pzFile,
                   char **pzErrMsg)

{
  char cVar1;
  uint uVar2;
  char *z_00;
  char *pcVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  char *pcVar10;
  sqlite3_vfs *psVar11;
  bool bVar12;
  bool local_c4;
  char *z;
  int mode;
  int i;
  int limit;
  int mask;
  char *zModeType;
  OpenMode *aMode;
  int nVal;
  char *zVal;
  int nOpt;
  int octet;
  u64 nByte;
  int local_70;
  int iOut;
  int iIn;
  int eState;
  char *zOpt;
  int nUri;
  char c;
  char *zFile;
  char *zVfs;
  uint flags;
  int rc;
  char **pzErrMsg_local;
  char **pzFile_local;
  sqlite3_vfs **ppVfs_local;
  uint *pFlags_local;
  char *zUri_local;
  char *zDefaultVfs_local;
  
  uVar2 = *pFlags;
  iVar6 = sqlite3Strlen30(zUri);
  zFile = zDefaultVfs;
  if (((((uVar2 & 0x40) == 0) && (sqlite3Config.bOpenUri == '\0')) || (iVar6 < 5)) ||
     (iVar7 = memcmp(zUri,"file:",5), iVar7 != 0)) {
    pvVar9 = sqlite3_malloc64((long)(iVar6 + 8));
    if (pvVar9 == (void *)0x0) {
      return 7;
    }
    memset(pvVar9,0,4);
    _nUri = (char *)((long)pvVar9 + 4);
    if (iVar6 != 0) {
      memcpy(_nUri,zUri,(long)iVar6);
    }
    memset(_nUri + iVar6,0,4);
    zVfs._0_4_ = uVar2 & 0xffffffbf;
  }
  else {
    nByte._4_4_ = 0;
    _nOpt = (sqlite3_uint64)(iVar6 + 8);
    zVfs._0_4_ = uVar2 | 0x40;
    for (local_70 = 0; local_70 < iVar6; local_70 = local_70 + 1) {
      _nOpt = (long)(int)(uint)(zUri[local_70] == '&') + _nOpt;
    }
    pvVar9 = sqlite3_malloc64(_nOpt);
    if (pvVar9 == (void *)0x0) {
      return 7;
    }
    memset(pvVar9,0,4);
    _nUri = (char *)((long)pvVar9 + 4);
    local_70 = 5;
    if ((zUri[5] == '/') && (zUri[6] == '/')) {
      local_70 = 7;
      while( true ) {
        bVar12 = false;
        if (zUri[local_70] != '\0') {
          bVar12 = zUri[local_70] != '/';
        }
        if (!bVar12) break;
        local_70 = local_70 + 1;
      }
      if ((local_70 != 7) &&
         ((local_70 != 0x10 || (iVar6 = memcmp("localhost",zUri + 7,9), iVar6 != 0)))) {
        pcVar10 = sqlite3_mprintf("invalid uri authority: %.*s",(ulong)(local_70 - 7),zUri + 7);
        *pzErrMsg = pcVar10;
        zVfs._4_4_ = 1;
        goto LAB_001d31c9;
      }
    }
    iOut = 0;
    while (zOpt._7_1_ = zUri[local_70], zOpt._7_1_ != '\0' && zOpt._7_1_ != '#') {
      iVar6 = local_70 + 1;
      if (((zOpt._7_1_ == '%') && ((""[(byte)zUri[iVar6]] & 8) != 0)) &&
         ((""[(byte)zUri[local_70 + 2]] & 8) != 0)) {
        iVar7 = local_70 + 2;
        bVar4 = sqlite3HexToInt((int)zUri[iVar6]);
        local_70 = local_70 + 3;
        bVar5 = sqlite3HexToInt((int)zUri[iVar7]);
        iVar6 = (uint)bVar5 + (uint)bVar4 * 0x10;
        if (iVar6 == 0) {
          while( true ) {
            cVar1 = zUri[local_70];
            local_c4 = false;
            if ((((cVar1 != '\0') && (local_c4 = false, cVar1 != '#')) &&
                ((iOut != 0 || (local_c4 = false, cVar1 != '?')))) &&
               ((iOut != 1 || ((local_c4 = false, cVar1 != '=' && (local_c4 = false, cVar1 != '&')))
                ))) {
              local_c4 = iOut != 2 || cVar1 != '&';
            }
            if (!local_c4) break;
            local_70 = local_70 + 1;
          }
        }
        else {
          zOpt._7_1_ = (char)iVar6;
LAB_001d2dc0:
          _nUri[nByte._4_4_] = zOpt._7_1_;
          nByte._4_4_ = nByte._4_4_ + 1;
        }
      }
      else {
        local_70 = iVar6;
        if ((iOut != 1) || ((zOpt._7_1_ != '&' && (zOpt._7_1_ != '=')))) {
          if (((iOut == 0) && (zOpt._7_1_ == '?')) || ((iOut == 2 && (zOpt._7_1_ == '&')))) {
            zOpt._7_1_ = '\0';
            iOut = 1;
          }
          goto LAB_001d2dc0;
        }
        if (_nUri[nByte._4_4_ + -1] != '\0') {
          if (zOpt._7_1_ == '&') {
            _nUri[nByte._4_4_] = '\0';
            nByte._4_4_ = nByte._4_4_ + 1;
          }
          else {
            iOut = 2;
          }
          zOpt._7_1_ = '\0';
          goto LAB_001d2dc0;
        }
        while( true ) {
          bVar12 = false;
          if ((zUri[local_70] != '\0') && (bVar12 = false, zUri[local_70] != '#')) {
            bVar12 = zUri[local_70 + -1] != '&';
          }
          if (!bVar12) break;
          local_70 = local_70 + 1;
        }
      }
    }
    if (iOut == 1) {
      _nUri[nByte._4_4_] = '\0';
      nByte._4_4_ = nByte._4_4_ + 1;
    }
    memset(_nUri + nByte._4_4_,0,4);
    iVar6 = sqlite3Strlen30(_nUri);
    _iIn = (int *)(_nUri + (iVar6 + 1));
    while ((char)*_iIn != '\0') {
      iVar6 = sqlite3Strlen30((char *)_iIn);
      pcVar10 = (char *)((long)_iIn + (long)(iVar6 + 1));
      iVar7 = sqlite3Strlen30(pcVar10);
      if ((iVar6 != 3) || (iVar8 = memcmp("vfs",_iIn,3), pcVar3 = pcVar10, iVar8 != 0)) {
        zModeType = (char *)0x0;
        _limit = (char *)0x0;
        i = 0;
        mode = 0;
        if ((iVar6 == 5) && (iVar8 = memcmp("cache",_iIn,5), iVar8 == 0)) {
          i = 0x60000;
          zModeType = (char *)sqlite3ParseUri::aCacheMode;
          mode = 0x60000;
          _limit = "cache";
        }
        if ((iVar6 == 4) && (*_iIn == 0x65646f6d)) {
          i = 0x87;
          zModeType = (char *)sqlite3ParseUri::aOpenMode;
          mode = (uint)zVfs & 0x87;
          _limit = "access";
        }
        pcVar3 = zFile;
        if (zModeType != (char *)0x0) {
          z._0_4_ = 0;
          z._4_4_ = 0;
          while (*(long *)(zModeType + (long)z._4_4_ * 0x10) != 0) {
            z_00 = *(char **)(zModeType + (long)z._4_4_ * 0x10);
            iVar6 = sqlite3Strlen30(z_00);
            if ((iVar7 == iVar6) && (iVar6 = memcmp(pcVar10,z_00,(long)iVar7), iVar6 == 0)) {
              z._0_4_ = *(uint *)(zModeType + (long)z._4_4_ * 0x10 + 8);
              break;
            }
            z._4_4_ = z._4_4_ + 1;
          }
          if ((uint)z == 0) {
            pcVar10 = sqlite3_mprintf("no such %s mode: %s",_limit,pcVar10);
            *pzErrMsg = pcVar10;
            zVfs._4_4_ = 1;
            goto LAB_001d31c9;
          }
          if (mode < (int)((uint)z & 0xffffff7f)) {
            pcVar10 = sqlite3_mprintf("%s mode not allowed: %s",_limit,pcVar10);
            *pzErrMsg = pcVar10;
            zVfs._4_4_ = 3;
            goto LAB_001d31c9;
          }
          zVfs._0_4_ = (uint)zVfs & (i ^ 0xffffffffU) | (uint)z;
        }
      }
      zFile = pcVar3;
      _iIn = (int *)(pcVar10 + (iVar7 + 1));
    }
  }
  psVar11 = sqlite3_vfs_find(zFile);
  *ppVfs = psVar11;
  psVar11 = *ppVfs;
  if (psVar11 == (sqlite3_vfs *)0x0) {
    pcVar10 = sqlite3_mprintf("no such vfs: %s",zFile);
    *pzErrMsg = pcVar10;
  }
  zVfs._4_4_ = (uint)(psVar11 == (sqlite3_vfs *)0x0);
LAB_001d31c9:
  if (zVfs._4_4_ != 0) {
    sqlite3_free_filename(_nUri);
    _nUri = (char *)0x0;
  }
  *pFlags = (uint)zVfs;
  *pzFile = _nUri;
  return zVfs._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ParseUri(
  const char *zDefaultVfs,        /* VFS to use if no "vfs=xxx" query option */
  const char *zUri,               /* Nul-terminated URI to parse */
  unsigned int *pFlags,           /* IN/OUT: SQLITE_OPEN_XXX flags */
  sqlite3_vfs **ppVfs,            /* OUT: VFS to use */
  char **pzFile,                  /* OUT: Filename component of URI */
  char **pzErrMsg                 /* OUT: Error message (if rc!=SQLITE_OK) */
){
  int rc = SQLITE_OK;
  unsigned int flags = *pFlags;
  const char *zVfs = zDefaultVfs;
  char *zFile;
  char c;
  int nUri = sqlite3Strlen30(zUri);

  assert( *pzErrMsg==0 );

  if( ((flags & SQLITE_OPEN_URI)             /* IMP: R-48725-32206 */
            || sqlite3GlobalConfig.bOpenUri) /* IMP: R-51689-46548 */
   && nUri>=5 && memcmp(zUri, "file:", 5)==0 /* IMP: R-57884-37496 */
  ){
    char *zOpt;
    int eState;                   /* Parser state when parsing URI */
    int iIn;                      /* Input character index */
    int iOut = 0;                 /* Output character index */
    u64 nByte = nUri+8;           /* Bytes of space to allocate */

    /* Make sure the SQLITE_OPEN_URI flag is set to indicate to the VFS xOpen
    ** method that there may be extra parameters following the file-name.  */
    flags |= SQLITE_OPEN_URI;

    for(iIn=0; iIn<nUri; iIn++) nByte += (zUri[iIn]=='&');
    zFile = sqlite3_malloc64(nByte);
    if( !zFile ) return SQLITE_NOMEM_BKPT;

    memset(zFile, 0, 4);  /* 4-byte of 0x00 is the start of DB name marker */
    zFile += 4;

    iIn = 5;
#ifdef SQLITE_ALLOW_URI_AUTHORITY
    if( strncmp(zUri+5, "///", 3)==0 ){
      iIn = 7;
      /* The following condition causes URIs with five leading / characters
      ** like file://///host/path to be converted into UNCs like //host/path.
      ** The correct URI for that UNC has only two or four leading / characters
      ** file://host/path or file:////host/path.  But 5 leading slashes is a
      ** common error, we are told, so we handle it as a special case. */
      if( strncmp(zUri+7, "///", 3)==0 ){ iIn++; }
    }else if( strncmp(zUri+5, "//localhost/", 12)==0 ){
      iIn = 16;
    }
#else
    /* Discard the scheme and authority segments of the URI. */
    if( zUri[5]=='/' && zUri[6]=='/' ){
      iIn = 7;
      while( zUri[iIn] && zUri[iIn]!='/' ) iIn++;
      if( iIn!=7 && (iIn!=16 || memcmp("localhost", &zUri[7], 9)) ){
        *pzErrMsg = sqlite3_mprintf("invalid uri authority: %.*s",
            iIn-7, &zUri[7]);
        rc = SQLITE_ERROR;
        goto parse_uri_out;
      }
    }
#endif

    /* Copy the filename and any query parameters into the zFile buffer.
    ** Decode %HH escape codes along the way.
    **
    ** Within this loop, variable eState may be set to 0, 1 or 2, depending
    ** on the parsing context. As follows:
    **
    **   0: Parsing file-name.
    **   1: Parsing name section of a name=value query parameter.
    **   2: Parsing value section of a name=value query parameter.
    */
    eState = 0;
    while( (c = zUri[iIn])!=0 && c!='#' ){
      iIn++;
      if( c=='%'
       && sqlite3Isxdigit(zUri[iIn])
       && sqlite3Isxdigit(zUri[iIn+1])
      ){
        int octet = (sqlite3HexToInt(zUri[iIn++]) << 4);
        octet += sqlite3HexToInt(zUri[iIn++]);

        assert( octet>=0 && octet<256 );
        if( octet==0 ){
#ifndef SQLITE_ENABLE_URI_00_ERROR
          /* This branch is taken when "%00" appears within the URI. In this
          ** case we ignore all text in the remainder of the path, name or
          ** value currently being parsed. So ignore the current character
          ** and skip to the next "?", "=" or "&", as appropriate. */
          while( (c = zUri[iIn])!=0 && c!='#'
              && (eState!=0 || c!='?')
              && (eState!=1 || (c!='=' && c!='&'))
              && (eState!=2 || c!='&')
          ){
            iIn++;
          }
          continue;
#else
          /* If ENABLE_URI_00_ERROR is defined, "%00" in a URI is an error. */
          *pzErrMsg = sqlite3_mprintf("unexpected %%00 in uri");
          rc = SQLITE_ERROR;
          goto parse_uri_out;
#endif
        }
        c = octet;
      }else if( eState==1 && (c=='&' || c=='=') ){
        if( zFile[iOut-1]==0 ){
          /* An empty option name. Ignore this option altogether. */
          while( zUri[iIn] && zUri[iIn]!='#' && zUri[iIn-1]!='&' ) iIn++;
          continue;
        }
        if( c=='&' ){
          zFile[iOut++] = '\0';
        }else{
          eState = 2;
        }
        c = 0;
      }else if( (eState==0 && c=='?') || (eState==2 && c=='&') ){
        c = 0;
        eState = 1;
      }
      zFile[iOut++] = c;
    }
    if( eState==1 ) zFile[iOut++] = '\0';
    memset(zFile+iOut, 0, 4); /* end-of-options + empty journal filenames */

    /* Check if there were any options specified that should be interpreted
    ** here. Options that are interpreted here include "vfs" and those that
    ** correspond to flags that may be passed to the sqlite3_open_v2()
    ** method. */
    zOpt = &zFile[sqlite3Strlen30(zFile)+1];
    while( zOpt[0] ){
      int nOpt = sqlite3Strlen30(zOpt);
      char *zVal = &zOpt[nOpt+1];
      int nVal = sqlite3Strlen30(zVal);

      if( nOpt==3 && memcmp("vfs", zOpt, 3)==0 ){
        zVfs = zVal;
      }else{
        struct OpenMode {
          const char *z;
          int mode;
        } *aMode = 0;
        char *zModeType = 0;
        int mask = 0;
        int limit = 0;

        if( nOpt==5 && memcmp("cache", zOpt, 5)==0 ){
          static struct OpenMode aCacheMode[] = {
            { "shared",  SQLITE_OPEN_SHAREDCACHE },
            { "private", SQLITE_OPEN_PRIVATECACHE },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_SHAREDCACHE|SQLITE_OPEN_PRIVATECACHE;
          aMode = aCacheMode;
          limit = mask;
          zModeType = "cache";
        }
        if( nOpt==4 && memcmp("mode", zOpt, 4)==0 ){
          static struct OpenMode aOpenMode[] = {
            { "ro",  SQLITE_OPEN_READONLY },
            { "rw",  SQLITE_OPEN_READWRITE },
            { "rwc", SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE },
            { "memory", SQLITE_OPEN_MEMORY },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_READONLY | SQLITE_OPEN_READWRITE
                   | SQLITE_OPEN_CREATE | SQLITE_OPEN_MEMORY;
          aMode = aOpenMode;
          limit = mask & flags;
          zModeType = "access";
        }

        if( aMode ){
          int i;
          int mode = 0;
          for(i=0; aMode[i].z; i++){
            const char *z = aMode[i].z;
            if( nVal==sqlite3Strlen30(z) && 0==memcmp(zVal, z, nVal) ){
              mode = aMode[i].mode;
              break;
            }
          }
          if( mode==0 ){
            *pzErrMsg = sqlite3_mprintf("no such %s mode: %s", zModeType, zVal);
            rc = SQLITE_ERROR;
            goto parse_uri_out;
          }
          if( (mode & ~SQLITE_OPEN_MEMORY)>limit ){
            *pzErrMsg = sqlite3_mprintf("%s mode not allowed: %s",
                                        zModeType, zVal);
            rc = SQLITE_PERM;
            goto parse_uri_out;
          }
          flags = (flags & ~mask) | mode;
        }
      }

      zOpt = &zVal[nVal+1];
    }

  }else{
    zFile = sqlite3_malloc64(nUri+8);
    if( !zFile ) return SQLITE_NOMEM_BKPT;
    memset(zFile, 0, 4);
    zFile += 4;
    if( nUri ){
      memcpy(zFile, zUri, nUri);
    }
    memset(zFile+nUri, 0, 4);
    flags &= ~SQLITE_OPEN_URI;
  }

  *ppVfs = sqlite3_vfs_find(zVfs);
  if( *ppVfs==0 ){
    *pzErrMsg = sqlite3_mprintf("no such vfs: %s", zVfs);
    rc = SQLITE_ERROR;
  }
 parse_uri_out:
  if( rc!=SQLITE_OK ){
    sqlite3_free_filename(zFile);
    zFile = 0;
  }
  *pFlags = flags;
  *pzFile = zFile;
  return rc;
}